

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

int GetIArg(size_t *i,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *opt)

{
  int iVar1;
  _Alloc_hider __nptr;
  int *piVar2;
  long lVar3;
  string errstr;
  string str;
  char *local_68 [4];
  string local_48;
  
  GetNextArg(&local_48,i,opt);
  __nptr._M_p = local_48._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr._M_p,local_68,10);
  if (local_68[0] == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return (int)lVar3;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

int GetIArg(size_t & i, const std::vector<std::string> & opt)
{
    std::string str = GetNextArg(i, opt);
    try {
        return stoi(str);
    }
    catch(...)
    {
        std::string errstr("Cannot convert to int: ");
        errstr += str;
        throw std::runtime_error(errstr);
    }
}